

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx512.cpp
# Opt level: O0

void ncnn::binary_op_vector_broadcast_b<ncnn::BinaryOp_x86_avx512_functor::binary_op_div>
               (float *ptr,float *ptr1,float *outptr,int size,int elempack)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  int in_ECX;
  float *in_RDX;
  undefined1 (*in_RSI) [64];
  undefined1 (*in_RDI) [64];
  int in_R8D;
  undefined1 auVar5 [64];
  __m128 _outp_2;
  __m128 _p_2;
  __m256 _outp_1;
  __m256 _p_1;
  __m512 _outp;
  __m512 _p;
  __m512 _b_512;
  __m256 _b_256;
  __m128 _b_128;
  int i;
  float b;
  binary_op_div op;
  undefined1 local_500 [64];
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 local_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 uStack_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  int local_2fc;
  float *local_2e8;
  undefined1 (*local_2d8) [64];
  
  fVar1 = *(float *)*in_RSI;
  local_2fc = 0;
  if (in_R8D == 4) {
    local_470 = *(undefined8 *)*in_RSI;
    uStack_468 = *(undefined8 *)(*in_RSI + 8);
  }
  else {
    local_470 = CONCAT44(fVar1,fVar1);
    uStack_468 = CONCAT44(fVar1,fVar1);
  }
  if (in_R8D == 8) {
    local_4a0 = *(undefined8 *)*in_RSI;
    uStack_498 = *(undefined8 *)(*in_RSI + 8);
    uStack_490 = *(undefined8 *)(*in_RSI + 0x10);
    uStack_488 = *(undefined8 *)(*in_RSI + 0x18);
  }
  else {
    local_4a0 = local_470;
    uStack_498 = uStack_468;
    uStack_490 = local_470;
    uStack_488 = uStack_468;
  }
  local_2e8 = in_RDX;
  local_2d8 = in_RDI;
  if (in_R8D == 0x10) {
    local_500 = *in_RSI;
  }
  else {
    auVar3._8_8_ = uStack_498;
    auVar3._0_8_ = local_4a0;
    auVar3._16_8_ = uStack_490;
    auVar3._24_8_ = uStack_488;
    local_500 = vinsertf64x4_avx512f
                          (ZEXT3264(CONCAT824(uStack_488,
                                              CONCAT816(uStack_490,CONCAT88(uStack_498,local_4a0))))
                           ,auVar3,1);
  }
  for (; local_2fc + 0xf < in_ECX; local_2fc = local_2fc + 0x10) {
    auVar5 = vdivps_avx512f(*local_2d8,local_500);
    local_400 = auVar5._0_8_;
    uStack_3f8 = auVar5._8_8_;
    uStack_3f0 = auVar5._16_8_;
    uStack_3e8 = auVar5._24_8_;
    uStack_3e0 = auVar5._32_8_;
    uStack_3d8 = auVar5._40_8_;
    uStack_3d0 = auVar5._48_8_;
    uStack_3c8 = auVar5._56_8_;
    *(undefined8 *)local_2e8 = local_400;
    *(undefined8 *)(local_2e8 + 2) = uStack_3f8;
    *(undefined8 *)(local_2e8 + 4) = uStack_3f0;
    *(undefined8 *)(local_2e8 + 6) = uStack_3e8;
    *(undefined8 *)(local_2e8 + 8) = uStack_3e0;
    *(undefined8 *)(local_2e8 + 10) = uStack_3d8;
    *(undefined8 *)(local_2e8 + 0xc) = uStack_3d0;
    *(undefined8 *)(local_2e8 + 0xe) = uStack_3c8;
    local_2d8 = local_2d8 + 1;
    local_2e8 = local_2e8 + 0x10;
  }
  for (; local_2fc + 7 < in_ECX; local_2fc = local_2fc + 8) {
    auVar4._8_8_ = uStack_498;
    auVar4._0_8_ = local_4a0;
    auVar4._16_8_ = uStack_490;
    auVar4._24_8_ = uStack_488;
    auVar3 = vdivps_avx(*(undefined1 (*) [32])*local_2d8,auVar4);
    local_440 = auVar3._0_8_;
    uStack_438 = auVar3._8_8_;
    uStack_430 = auVar3._16_8_;
    uStack_428 = auVar3._24_8_;
    *(undefined8 *)local_2e8 = local_440;
    *(undefined8 *)(local_2e8 + 2) = uStack_438;
    *(undefined8 *)(local_2e8 + 4) = uStack_430;
    *(undefined8 *)(local_2e8 + 6) = uStack_428;
    local_2d8 = (undefined1 (*) [64])(*local_2d8 + 0x20);
    local_2e8 = local_2e8 + 8;
  }
  for (; local_2fc + 3 < in_ECX; local_2fc = local_2fc + 4) {
    auVar2._8_8_ = uStack_468;
    auVar2._0_8_ = local_470;
    auVar2 = vdivps_avx(*(undefined1 (*) [16])*local_2d8,auVar2);
    local_460 = auVar2._0_8_;
    uStack_458 = auVar2._8_8_;
    *(undefined8 *)local_2e8 = local_460;
    *(undefined8 *)(local_2e8 + 2) = uStack_458;
    local_2d8 = (undefined1 (*) [64])(*local_2d8 + 0x10);
    local_2e8 = local_2e8 + 4;
  }
  for (; local_2fc < in_ECX; local_2fc = local_2fc + 1) {
    *local_2e8 = *(float *)*local_2d8 / fVar1;
    local_2d8 = (undefined1 (*) [64])(*local_2d8 + 4);
    local_2e8 = local_2e8 + 1;
  }
  return;
}

Assistant:

static void binary_op_vector_broadcast_b(const float* ptr, const float* ptr1, float* outptr, int size, int elempack)
{
    const Op op;

    const float b = *ptr1;

    int i = 0;
#if __SSE2__
    __m128 _b_128 = (elempack == 4) ? _mm_loadu_ps(ptr1) : _mm_set1_ps(b);
#if __AVX__
    __m256 _b_256 = (elempack == 8) ? _mm256_loadu_ps(ptr1) : _mm256_insertf128_ps(_mm256_castps128_ps256(_b_128), _b_128, 1);
#if __AVX512F__
    __m512 _b_512 = (elempack == 16) ? _mm512_loadu_ps(ptr1) : _mm512_insertf32x8(_mm512_castps256_ps512(_b_256), _b_256, 1);
    for (; i + 15 < size; i += 16)
    {
        __m512 _p = _mm512_loadu_ps(ptr);
        __m512 _outp = op.func_pack16(_p, _b_512);
        _mm512_storeu_ps(outptr, _outp);
        ptr += 16;
        outptr += 16;
    }
#endif // __AVX512F__
    for (; i + 7 < size; i += 8)
    {
        __m256 _p = _mm256_loadu_ps(ptr);
        __m256 _outp = op.func_pack8(_p, _b_256);
        _mm256_storeu_ps(outptr, _outp);
        ptr += 8;
        outptr += 8;
    }
#endif // __AVX__
    for (; i + 3 < size; i += 4)
    {
        __m128 _p = _mm_loadu_ps(ptr);
        __m128 _outp = op.func_pack4(_p, _b_128);
        _mm_storeu_ps(outptr, _outp);
        ptr += 4;
        outptr += 4;
    }
#endif // __SSE2__
    for (; i < size; i++)
    {
        *outptr = op.func(*ptr, b);
        ptr += 1;
        outptr += 1;
    }
}